

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimSetInitMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  
  if (p0->pReprs != (Aig_Obj_t **)0x0) {
    pAVar2 = p0->pConst1;
    pAVar3 = p1->pConst1;
    p0->pReprs[pAVar2->Id] = pAVar3;
    if (p1->pReprs != (Aig_Obj_t **)0x0) {
      p1->pReprs[pAVar3->Id] = pAVar2;
      iVar1 = p0->nTruePis;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          if ((p0->vCis->nSize <= lVar4) || (p1->vCis->nSize <= lVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (p0->pReprs == (Aig_Obj_t **)0x0) goto LAB_0063f871;
          pAVar2 = (Aig_Obj_t *)p0->vCis->pArray[lVar4];
          pAVar3 = (Aig_Obj_t *)p1->vCis->pArray[lVar4];
          p0->pReprs[pAVar2->Id] = pAVar3;
          if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_0063f871;
          p1->pReprs[pAVar3->Id] = pAVar2;
          lVar4 = lVar4 + 1;
        } while (iVar1 != lVar4);
      }
      return;
    }
  }
LAB_0063f871:
  __assert_fail("p->pReprs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Saig_StrSimSetInitMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    Aig_ObjSetRepr( p0, pObj0, pObj1 );
    Aig_ObjSetRepr( p1, pObj1, pObj0 );
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
}